

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void FIX::HttpServer::startGlobal(SessionSettings *s)

{
  bool bVar1;
  HttpServer *this;
  allocator<char> local_41;
  string local_40;
  
  Mutex::lock((Mutex *)s_mutex);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"HttpAcceptPort",&local_41)
  ;
  bVar1 = Dictionary::has(&s->m_defaults,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    s_count = s_count + 1;
    if (s_pServer == (HttpServer *)0x0) {
      this = (HttpServer *)operator_new(0xb0);
      HttpServer(this,s);
      s_pServer = this;
      start(this);
    }
  }
  Mutex::unlock((Mutex *)s_mutex);
  return;
}

Assistant:

EXCEPT(ConfigError, RuntimeError) {
  Locker l(s_mutex);

  if (!s.get().has(HTTP_ACCEPT_PORT)) {
    return;
  }

  s_count += 1;
  if (!s_pServer) {
    s_pServer = new HttpServer(s);
    s_pServer->start();
  }
}